

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O0

int msocket_accept_inet6(msocket_t *self,msocket_t *child)

{
  uint16_t uVar1;
  char *pcVar2;
  socklen_t local_44;
  int local_40;
  socklen_t cli_len;
  int sockfd;
  sockaddr_in6 cli_addr6;
  msocket_t *child_local;
  msocket_t *self_local;
  
  local_44 = 0x1c;
  cli_addr6._20_8_ = child;
  memset(&cli_len,0,0x1c);
  local_40 = accept(self->tcpsockfd,(sockaddr *)&cli_len,&local_44);
  if (local_40 < 0) {
    self_local._4_4_ = -1;
  }
  else {
    pcVar2 = inet_ntop(2,&cli_addr6,(char *)(cli_addr6._20_8_ + 0x3a),0x2e);
    if (pcVar2 == (char *)0x0) {
      close(local_40);
      self_local._4_4_ = -1;
    }
    else {
      uVar1 = ntohs(cli_len._2_2_);
      *(uint16_t *)(cli_addr6._20_8_ + 0x38) = uVar1;
      *(int *)cli_addr6._20_8_ = local_40;
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

static int msocket_accept_inet6(msocket_t* self, msocket_t* child) {
   struct sockaddr_in6 cli_addr6;
   SOCKET_T sockfd;
#ifdef _WIN32
   int cli_len;
#else
   socklen_t cli_len;
#endif

   cli_len = sizeof(cli_addr6);
   memset(&cli_addr6, 0, cli_len);
   sockfd = accept(self->tcpsockfd, (struct sockaddr*) &cli_addr6, &cli_len);
   if (IS_INVALID_SOCKET(sockfd)) {
      return -1;
   }
   if (inet_ntop(AF_INET, &(cli_addr6.sin6_addr), child->tcpInfo.addr, MSOCKET_ADDRSTRLEN) == NULL) {
      SOCKET_CLOSE(sockfd);
      return -1;
   }
   child->tcpInfo.port = ntohs(cli_addr6.sin6_port);
   child->tcpsockfd = sockfd;
   return 0;
}